

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart.hpp
# Opt level: O0

Lazy<cinatra::chunked_result> __thiscall
cinatra::multipart_reader_t<cinatra::coro_http_connection>::read_part_body
          (multipart_reader_t<cinatra::coro_http_connection> *this,string_view boundary)

{
  ulong uVar1;
  undefined8 *puVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view delim;
  string_view delim_00;
  bool bVar3;
  undefined8 *puVar4;
  undefined8 *extraout_RAX;
  char *pcVar5;
  size_type sVar6;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined8 *puVar7;
  error_code *this_01;
  ulong *puVar8;
  size_t *psVar9;
  size_t in_RDX;
  undefined8 in_RSI;
  LazyBase<cinatra::chunked_result,_false> in_RDI;
  string_view complete_flag;
  string data;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  tuple<std::error_code_&,_unsigned_long_&> *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  coro_http_connection *in_stack_fffffffffffffc38;
  size_t n;
  basic_streambuf<std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_streambuf<std::allocator<char>_> *this_02;
  char *in_stack_fffffffffffffc48;
  allocator<char> local_201 [33];
  const_buffer local_1e0;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  basic_string_view<char,_std::char_traits<char>_> bStack_1b8;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_1a8;
  __sv_type local_190;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  const_buffer local_148;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_130;
  size_t local_108;
  undefined8 uStack_100;
  size_t local_28;
  undefined8 local_20;
  
  local_28 = in_RDX;
  local_20 = in_RCX;
  puVar4 = (undefined8 *)operator_new(0x128,(nothrow_t *)&std::nothrow);
  if (puVar4 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar4 = read_part_body;
    puVar4[1] = read_part_body;
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0x16);
    puVar7 = puVar4 + 0xb;
    this_01 = (error_code *)(puVar4 + 0x18);
    puVar8 = puVar4 + 0x1c;
    psVar9 = puVar4 + 0x20;
    puVar4[0x23] = in_RSI;
    this_00->_M_len = local_28;
    puVar4[0x17] = local_20;
    async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::LazyPromise
              ((LazyPromise<cinatra::chunked_result> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::get_return_object
              ((LazyPromise<cinatra::chunked_result> *)
               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar4 + 2));
    bVar3 = std::suspend_always::await_ready((suspend_always *)((long)puVar4 + 0x125));
    if (bVar3) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar4 + 0x125));
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      *(undefined1 *)(puVar4 + 0xd) = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0xe));
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      *puVar8 = 0;
      local_108 = this_00->_M_len;
      uStack_100 = puVar4[0x17];
      delim._M_str = in_stack_fffffffffffffc48;
      delim._M_len = (size_t)in_stack_fffffffffffffc40;
      coro_http_connection::async_read_until<asio::basic_streambuf<std::allocator<char>>>
                (in_stack_fffffffffffffc38,
                 (basic_streambuf<std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),delim);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      bVar3 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar4 + 0x1d));
      if (bVar3) {
        puVar4[0x1a] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                       (puVar4 + 0x1d);
        async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
        awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        std::tie<std::error_code,unsigned_long>
                  ((error_code *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        local_130 = std::tuple<std::error_code&,unsigned_long&>::operator=
                              (in_stack_fffffffffffffc20,
                               (pair<std::error_code,_unsigned_long> *)
                               CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
        ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x6830b0);
        async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                  ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x6830bd);
        bVar3 = std::error_code::operator_cast_to_bool(this_01);
        if (bVar3) {
          *puVar7 = *(undefined8 *)this_01;
          puVar4[0xc] = puVar4[0x19];
          coro_http_connection::close(*(coro_http_connection **)puVar4[0x23],1);
          async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
          return_value<cinatra::chunked_result>
                    ((LazyPromise<cinatra::chunked_result> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (chunked_result *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)
                    );
        }
        else {
          local_148 = (const_buffer)
                      asio::basic_streambuf<std::allocator<char>_>::data(in_stack_fffffffffffffc40);
          pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x6831d0);
          *psVar9 = (size_t)pcVar5;
          asio::basic_streambuf<std::allocator<char>_>::consume
                    (in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38);
          pcVar5 = (char *)*psVar9;
          uVar1 = *puVar8;
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_158,pcVar5,(uVar1 - sVar6) - 4);
          puVar4[0xe] = local_158._M_len;
          puVar4[0xf] = local_158._M_str;
          local_190 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          delim_00._M_str = in_stack_fffffffffffffc48;
          delim_00._M_len = (size_t)in_stack_fffffffffffffc40;
          coro_http_connection::async_read_until<asio::basic_streambuf<std::allocator<char>>>
                    (in_stack_fffffffffffffc38,
                     (basic_streambuf<std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),delim_00);
          async_simple::coro::detail::LazyPromiseBase::
          await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                    ((LazyPromiseBase *)
                     CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                     (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          bVar3 = async_simple::coro::detail::
                  LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                            ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                             (puVar4 + 0x21));
          if (!bVar3) {
            *(undefined1 *)((long)puVar4 + 0x124) = 2;
            cinatra::multipart_reader_t
                      ((void *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (void *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_.__handle_;
          }
          puVar4[0x1b] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar4 + 0x21);
          async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
          awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          std::tie<std::error_code,unsigned_long>
                    ((error_code *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                     (unsigned_long *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))
          ;
          local_1a8 = std::tuple<std::error_code&,unsigned_long&>::operator=
                                (in_stack_fffffffffffffc20,
                                 (pair<std::error_code,_unsigned_long> *)
                                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
          ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x683474);
          async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                    ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x683481);
          bVar3 = std::error_code::operator_cast_to_bool(this_01);
          if (bVar3) {
            puVar2 = (undefined8 *)puVar4[0x23];
            std::error_code::error_code
                      ((error_code *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            local_1c0 = 0;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&bStack_1b8);
            puVar4[0xf] = bStack_1b8._M_str;
            puVar4[0xd] = CONCAT71(uStack_1bf,local_1c0);
            puVar4[0xe] = bStack_1b8._M_len;
            *puVar7 = local_1d0;
            puVar4[0xc] = uStack_1c8;
            *puVar7 = *(undefined8 *)this_01;
            puVar4[0xc] = puVar4[0x19];
            coro_http_connection::close((coro_http_connection *)*puVar2,1);
            async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
            return_value<cinatra::chunked_result>
                      ((LazyPromise<cinatra::chunked_result> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (chunked_result *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          }
          else {
            local_1e0 = (const_buffer)
                        asio::basic_streambuf<std::allocator<char>_>::data
                                  (in_stack_fffffffffffffc40);
            pcVar5 = asio::buffer_cast<char_const*>((const_buffer *)0x6835a6);
            *psVar9 = (size_t)pcVar5;
            n = *psVar9;
            this_02 = (basic_streambuf<std::allocator<char>_> *)*puVar8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       (size_type)in_stack_fffffffffffffc20,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
            std::allocator<char>::~allocator(local_201);
            if (2 < *puVar8) {
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
              __x._M_str = (char *)this_02;
              __x._M_len = n;
              __y._M_len._4_4_ = in_stack_fffffffffffffc2c;
              __y._M_len._0_4_ = in_stack_fffffffffffffc28;
              __y._M_str._0_4_ = in_stack_fffffffffffffc30;
              __y._M_str._4_4_ = in_stack_fffffffffffffc34;
              bVar3 = std::operator==(__x,__y);
              if (bVar3) {
                *(undefined1 *)(puVar4 + 0xd) = 1;
              }
            }
            asio::basic_streambuf<std::allocator<char>_>::consume(this_02,n);
            async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::
            return_value<cinatra::chunked_result>
                      ((LazyPromise<cinatra::chunked_result> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (chunked_result *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          }
        }
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar4 + 2));
        bVar3 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar4 + 0x126));
        if (bVar3) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar4 + 0x126));
          async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::~LazyPromise
                    ((LazyPromise<cinatra::chunked_result> *)0x6838eb);
          if (puVar4 != (undefined8 *)0x0) {
            operator_delete(puVar4,0x128);
          }
        }
        else {
          *puVar4 = 0;
          *(undefined1 *)((long)puVar4 + 0x124) = 3;
          cinatra::multipart_reader_t
                    (in_stack_fffffffffffffc20,
                     (void *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          (*(code *)*extraout_RAX_01)(extraout_RAX_01);
        }
      }
      else {
        *(undefined1 *)((long)puVar4 + 0x124) = 1;
        cinatra::multipart_reader_t
                  ((void *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (void *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar4 + 0x124) = 0;
      cinatra::multipart_reader_t
                (in_stack_fffffffffffffc20,
                 (void *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    }
  }
  return (Lazy<cinatra::chunked_result>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<chunked_result> read_part_body(
      std::string_view boundary) {
    chunked_result result{};
    std::error_code ec{};
    size_t size = 0;

    if (std::tie(ec, size) =
            co_await conn_->async_read_until(chunked_buf_, boundary);
        ec) {
      result.ec = ec;
      conn_->close();
      co_return result;
    }

    const char *data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    chunked_buf_.consume(size);
    result.data = std::string_view{
        data_ptr, size - boundary.size() - 4};  //-- boundary \r\n

    if (std::tie(ec, size) =
            co_await conn_->async_read_until(chunked_buf_, CRCF);
        ec) {
      result = {};
      result.ec = ec;
      conn_->close();
      co_return result;
    }

    data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    std::string data{data_ptr, size};
    if (size > 2) {
      constexpr std::string_view complete_flag = "--\r\n";
      if (data == complete_flag) {
        result.eof = true;
      }
    }

    chunked_buf_.consume(size);
    co_return result;
  }